

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SetQueue.h
# Opt level: O0

void __thiscall
dg::ADT::SetQueue<dg::ADT::QueueFIFO<const_llvm::BasicBlock_*>_>::push
          (SetQueue<dg::ADT::QueueFIFO<const_llvm::BasicBlock_*>_> *this,ValueType *what)

{
  set<const_llvm::BasicBlock_*,_std::less<const_llvm::BasicBlock_*>,_std::allocator<const_llvm::BasicBlock_*>_>
  *in_RSI;
  BasicBlock **in_RDI;
  pair<std::_Rb_tree_const_iterator<const_llvm::BasicBlock_*>,_bool> pVar1;
  undefined1 in_stack_ffffffffffffffe8;
  undefined7 in_stack_ffffffffffffffe9;
  
  pVar1 = std::
          set<const_llvm::BasicBlock_*,_std::less<const_llvm::BasicBlock_*>,_std::allocator<const_llvm::BasicBlock_*>_>
          ::insert(in_RSI,(value_type *)
                          CONCAT71(in_stack_ffffffffffffffe9,in_stack_ffffffffffffffe8));
  if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    QueueFIFO<const_llvm::BasicBlock_*>::push
              ((QueueFIFO<const_llvm::BasicBlock_*> *)pVar1.first._M_node._M_node,in_RDI);
  }
  return;
}

Assistant:

void push(const ValueType &what) {
        if (_queued.insert(what).second)
            _queue.push(what);
    }